

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigVec.c
# Opt level: O0

int Fraig_NodeVecCompareRefCounts(Fraig_Node_t **pp1,Fraig_Node_t **pp2)

{
  int iVar1;
  int iVar2;
  int nRefs2;
  int nRefs1;
  Fraig_Node_t **pp2_local;
  Fraig_Node_t **pp1_local;
  
  iVar1 = *(int *)(((ulong)*pp1 & 0xfffffffffffffffe) + 0xc);
  iVar2 = *(int *)(((ulong)*pp2 & 0xfffffffffffffffe) + 0xc);
  if (iVar1 < iVar2) {
    pp1_local._4_4_ = -1;
  }
  else if (iVar2 < iVar1) {
    pp1_local._4_4_ = 1;
  }
  else {
    iVar1 = *(int *)(((ulong)*pp1 & 0xfffffffffffffffe) + 8);
    iVar2 = *(int *)(((ulong)*pp2 & 0xfffffffffffffffe) + 8);
    if (iVar1 < iVar2) {
      pp1_local._4_4_ = -1;
    }
    else if (iVar2 < iVar1) {
      pp1_local._4_4_ = 1;
    }
    else {
      pp1_local._4_4_ = 0;
    }
  }
  return pp1_local._4_4_;
}

Assistant:

int Fraig_NodeVecCompareRefCounts( Fraig_Node_t ** pp1, Fraig_Node_t ** pp2 )
{
    int nRefs1 = Fraig_Regular(*pp1)->nRefs;
    int nRefs2 = Fraig_Regular(*pp2)->nRefs;

    if ( nRefs1 < nRefs2 )
        return -1;
    if ( nRefs1 > nRefs2 )
        return 1;

    nRefs1 = Fraig_Regular(*pp1)->Level;
    nRefs2 = Fraig_Regular(*pp2)->Level;

    if ( nRefs1 < nRefs2 )
        return -1;
    if ( nRefs1 > nRefs2 )
        return 1;
    return 0; 
}